

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpcommon_label.c
# Opt level: O2

void JPCommonLabel_insert_pause(JPCommonLabel *label)

{
  JPCommonLabelPhoneme *pJVar1;
  int iVar2;
  _JPCommonLabelPhoneme *p_Var3;
  char *pcVar4;
  
  if (label->short_pause_flag == 1) {
    pJVar1 = label->phoneme_tail;
    if (pJVar1 == (JPCommonLabelPhoneme *)0x0) {
      fwrite("WARNING: JPCommonLabel_insert_pause() in jpcommon_label.c: First mora should not be short pause.\n"
             ,0x61,1,_stderr);
    }
    else {
      iVar2 = strcmp(pJVar1->phoneme,"pau");
      if (iVar2 == 0) {
        fwrite("WARNING: JPCommonLabel_insert_pause() in jpcommon_label.c: Short pause should not be chained.\n"
               ,0x5e,1,_stderr);
        return;
      }
      p_Var3 = (_JPCommonLabelPhoneme *)calloc(1,0x20);
      pJVar1->next = p_Var3;
      pcVar4 = strdup("pau");
      p_Var3->phoneme = pcVar4;
      p_Var3->prev = pJVar1;
      label->phoneme_tail = p_Var3;
    }
    label->short_pause_flag = 0;
  }
  return;
}

Assistant:

static void JPCommonLabel_insert_pause(JPCommonLabel * label)
{
   /* insert short pause */
   if (label->short_pause_flag == 1) {
      if (label->phoneme_tail != NULL) {
         if (strcmp(label->phoneme_tail->phoneme, JPCOMMON_PHONEME_SHORT_PAUSE) == 0) {
            fprintf(stderr,
                    "WARNING: JPCommonLabel_insert_pause() in jpcommon_label.c: Short pause should not be chained.\n");
            return;
         }
         label->phoneme_tail->next =
             (JPCommonLabelPhoneme *) calloc(1, sizeof(JPCommonLabelPhoneme));
         JPCommonLabelPhoneme_initialize(label->phoneme_tail->next, JPCOMMON_PHONEME_SHORT_PAUSE,
                                         label->phoneme_tail, NULL, NULL);
         label->phoneme_tail = label->phoneme_tail->next;
      } else {
         fprintf(stderr,
                 "WARNING: JPCommonLabel_insert_pause() in jpcommon_label.c: First mora should not be short pause.\n");
      }
      label->short_pause_flag = 0;
   }
}